

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O3

UINT8 __thiscall VGMPlayer::SetDeviceOptions(VGMPlayer *this,UINT32 id,PLR_DEV_OPTS *devOpts)

{
  ulong uVar1;
  DEVFUNC_OPTMASK p_Var2;
  bool bVar3;
  byte bVar4;
  UINT8 UVar5;
  size_t sVar6;
  long lVar7;
  VGMPlayer *this_00;
  VGM_BASEDEV *clDev;
  pointer pCVar8;
  
  sVar6 = DeviceID2OptionID(this,id);
  if (sVar6 == 0xffffffffffffffff) {
    UVar5 = 0x80;
  }
  else {
    memcpy(this->_devOpts + sVar6,devOpts,0xa0);
    uVar1 = this->_optDevMap[sVar6];
    pCVar8 = (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)(((long)(this->_devices).
                               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 4) *
                       -0x1111111111111111)) {
      RefreshDevOptions(this,pCVar8 + uVar1,this->_devOpts + sVar6);
      pCVar8 = (this->_devices).
               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar1;
      bVar4 = 1;
      lVar7 = 0;
      do {
        this_00 = (VGMPlayer *)(pCVar8->base).defInf.dataPtr;
        if ((this_00 != (VGMPlayer *)0x0) &&
           (p_Var2 = ((pCVar8->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0)) {
          (*p_Var2)(this_00,this->_devOpts[sVar6].muteOpts.chnMute[lVar7]);
        }
        pCVar8 = (pointer)(pCVar8->base).linkDev;
        lVar7 = 1;
        bVar3 = (bool)(bVar4 & pCVar8 != (pointer)0x0);
        bVar4 = 0;
      } while (bVar3);
      RefreshPanning(this_00,(this->_devices).
                             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar1,
                     &this->_devOpts[sVar6].panOpts);
    }
    UVar5 = '\0';
  }
  return UVar5;
}

Assistant:

UINT8 VGMPlayer::SetDeviceOptions(UINT32 id, const PLR_DEV_OPTS& devOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID] = devOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
	{
		DEV_INFO* devInf = &_devices[devID].base.defInf;
		RefreshDevOptions(_devices[devID], _devOpts[optID]);
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
		RefreshPanning(_devices[devID], _devOpts[optID].panOpts);
	}
	return 0x00;
}